

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_display_driver.cpp
# Opt level: O1

void __thiscall MdDisplayDriver::display(MdDisplayDriver *this,Document *doc,ostream *output)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int local_6c;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  Document *local_40;
  ulong local_38;
  
  lVar3 = Document::size();
  if (lVar3 != 0) {
    uVar9 = 0;
    local_6c = 1;
    local_40 = doc;
    do {
      plVar4 = (long *)Document::operator[]((ulong)doc);
      uVar1 = (**(code **)(*plVar4 + 8))(plVar4);
      local_38 = uVar9;
      switch(uVar1) {
      case 1:
        lVar3 = 2;
        pcVar8 = "# ";
        break;
      case 2:
        lVar3 = 3;
        pcVar8 = "## ";
        break;
      case 3:
        lVar3 = 4;
        pcVar8 = "### ";
        break;
      case 7:
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)output,local_6c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        local_6c = local_6c + 1;
      default:
        goto LAB_00123e57;
      case 8:
        lVar3 = 2;
        pcVar8 = "* ";
        break;
      case 9:
        lVar3 = 4;
        pcVar8 = "  * ";
        break;
      case 10:
        lVar3 = 2;
        pcVar8 = "> ";
        break;
      case 0xb:
        lVar3 = 4;
        pcVar8 = "    ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar8,lVar3);
LAB_00123e57:
      lVar3 = Paragraph::size();
      if (lVar3 != 0) {
        uVar9 = 0;
        local_48 = plVar4;
        do {
          plVar4 = (long *)Paragraph::operator[]((ulong)plVar4);
          if (plVar4 == (long *)0x0) {
            bVar10 = true;
            lVar3 = 0;
          }
          else {
            lVar3 = __dynamic_cast(plVar4,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
            bVar10 = lVar3 == 0;
            lVar3 = __dynamic_cast(plVar4,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
          }
          bVar12 = true;
          bVar11 = true;
          if (plVar4 != (long *)0x0) {
            lVar5 = __dynamic_cast(plVar4,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
            bVar11 = lVar5 == 0;
            lVar5 = __dynamic_cast(plVar4,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
            bVar12 = lVar5 == 0;
          }
          if ((bVar10) || (iVar2 = (**(code **)(*local_48 + 8))(), iVar2 == 0xb)) {
            if (lVar3 != 0) {
              lVar5 = 1;
              pcVar8 = "[";
              goto LAB_00123f85;
            }
            if (!bVar11) {
              lVar5 = 2;
              pcVar8 = "**";
              goto LAB_00123f85;
            }
            if (!bVar12) {
              lVar5 = 1;
              pcVar8 = "*";
              goto LAB_00123f85;
            }
          }
          else {
            lVar5 = 1;
            pcVar8 = "`";
LAB_00123f85:
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar8,lVar5);
          }
          (**(code **)(*plVar4 + 0x10))(&local_68,plVar4);
          std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_68,local_60);
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          plVar4 = local_48;
          if ((bVar10) || (iVar2 = (**(code **)(*local_48 + 8))(local_48), iVar2 == 0xb)) {
            if (lVar3 == 0) {
              if (bVar11) {
                if (bVar12) goto LAB_0012408e;
                lVar3 = 1;
                pcVar8 = "*";
              }
              else {
                lVar3 = 2;
                pcVar8 = "**";
              }
              goto LAB_00124089;
            }
            std::__ostream_insert<char,std::char_traits<char>>(output,"](",2);
            UrlLineElement::url_abi_cxx11_();
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,(char *)local_68,local_60);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
            if (local_68 != local_58) {
              operator_delete(local_68,local_58[0] + 1);
            }
          }
          else {
            lVar3 = 1;
            pcVar8 = "`";
LAB_00124089:
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar8,lVar3);
          }
LAB_0012408e:
          uVar9 = uVar9 + 1;
          uVar7 = Paragraph::size();
        } while (uVar9 < uVar7);
      }
      iVar2 = (**(code **)(*plVar4 + 8))(plVar4);
      if (iVar2 != 7) {
        local_6c = 1;
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + (char)output);
      std::ostream::put((char)output);
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      doc = local_40;
      uVar9 = local_38 + 1;
      uVar7 = Document::size();
    } while (uVar9 < uVar7);
  }
  return;
}

Assistant:

void MdDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);

	int olist1_index(1);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "# ";
				break;
			case Paragraph::Level::Title2:
				output << "## ";
				break;
			case Paragraph::Level::Title3:
				output << "### ";
				break;
			case Paragraph::Level::UList1:
				output << "* ";
				break;
			case Paragraph::Level::UList2:
				output << "  * ";
				break;
			case Paragraph::Level::OList1:
				output << olist1_index << ") ";
				++olist1_index;
				break;
			case Paragraph::Level::Quote:
				output << "> ";
				break;
			case Paragraph::Level::Code:
				output << "    ";
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "[";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "](" << url_le->url() << ")";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		if (p->level() != Paragraph::Level::OList1) {
			olist1_index = 1;
		}

		output << endl << endl;
	}
}